

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O0

void Js::Exception::RecoverUnusedMemory(void)

{
  ThreadContext *this;
  Recycler *this_00;
  Recycler *threadRecycler;
  ThreadContext *threadContext;
  
  this = ThreadContext::GetContextForCurrentThread();
  if ((this != (ThreadContext *)0x0) &&
     (this_00 = ThreadContext::GetRecycler(this), this_00 != (Recycler *)0x0)) {
    Memory::Recycler::CollectNow<(Memory::CollectionFlags)1073758208>(this_00);
  }
  return;
}

Assistant:

void Exception::RecoverUnusedMemory()
    {
        ThreadContext* threadContext = ThreadContext::GetContextForCurrentThread();
        if (threadContext)
        {
            Recycler* threadRecycler = threadContext->GetRecycler();
            if (threadRecycler)
            {
                try
                {
                    threadRecycler->CollectNow<CollectOnRecoverFromOutOfMemory>();
                }
                catch (...)
                {
                    // Technically, exception is a valid scenario: we asked to recover mem, and it couldn't.
                    // Do not let the exception leak out.
                }
            }
        }
    }